

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O0

int stbi_write_hdr(char *filename,int x,int y,int comp,float *data)

{
  int iVar1;
  undefined1 local_88 [4];
  int r;
  stbi__write_context s;
  float *data_local;
  int comp_local;
  int y_local;
  int x_local;
  char *filename_local;
  
  s._80_8_ = data;
  memset(local_88,0,0x58);
  iVar1 = stbi__start_write_file((stbi__write_context *)local_88,filename);
  if (iVar1 == 0) {
    filename_local._4_4_ = 0;
  }
  else {
    filename_local._4_4_ =
         stbi_write_hdr_core((stbi__write_context *)local_88,x,y,comp,(float *)s._80_8_);
    stbi__end_write_file((stbi__write_context *)local_88);
  }
  return filename_local._4_4_;
}

Assistant:

STBIWDEF int stbi_write_hdr(char const *filename, int x, int y, int comp, const float *data)
{
   stbi__write_context s = { 0 };
   if (stbi__start_write_file(&s,filename)) {
      int r = stbi_write_hdr_core(&s, x, y, comp, (float *) data);
      stbi__end_write_file(&s);
      return r;
   } else
      return 0;
}